

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Matrix4x4 * CGL::outer(Vector4D *u,Vector4D *v)

{
  double dVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  Matrix4x4 *B;
  anon_union_32_3_e2189aaa_for_Vector4D_0 *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  
  auVar8 = ZEXT816(0) << 0x40;
  in_RDI[3] = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(auVar8);
  in_RDI[2] = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(auVar8);
  in_RDI[1] = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(auVar8);
  *in_RDI = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(auVar8);
  dVar3 = (v->field_0).field_0.x;
  dVar4 = (v->field_0).field_0.y;
  dVar5 = (v->field_0).field_0.z;
  dVar6 = (v->field_0).field_0.w;
  lVar7 = 0;
  do {
    dVar1 = *(double *)((long)&u->field_0 + lVar7 * 8);
    auVar8._0_8_ = dVar1 * dVar3;
    auVar8._8_8_ = dVar1 * dVar4;
    auVar9._16_8_ = dVar1 * dVar5;
    auVar9._0_16_ = auVar8;
    auVar9._24_8_ = dVar1 * dVar6;
    uVar2 = vmovlpd_avx(auVar8);
    *(undefined8 *)((long)in_RDI + lVar7 * 8) = uVar2;
    uVar2 = vmovhpd_avx(auVar8);
    *(undefined8 *)((long)in_RDI + lVar7 * 8 + 0x20) = uVar2;
    uVar2 = vmovlpd_avx(auVar9._16_16_);
    *(undefined8 *)((long)in_RDI + lVar7 * 8 + 0x40) = uVar2;
    uVar2 = vmovhpd_avx(auVar9._16_16_);
    *(undefined8 *)((long)in_RDI + lVar7 * 8 + 0x60) = uVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  return (Matrix4x4 *)in_RDI;
}

Assistant:

Matrix4x4 outer(const Vector4D &u, const Vector4D &v) {
  Matrix4x4 B;

  // Opposite of an inner product.
  for (int i = 0; i < 4; i++)
    for (int j = 0; j < 4; j++) {
      B(i, j) = u[i] * v[j];
    }

  return B;
}